

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KRuntime_raise(KonohaContext *kctx,int symbol,int fault,kString *optionalErrorInfo,
                   KonohaStack *top)

{
  long lVar1;
  long lVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  kException *e;
  KRuntimeContextVar *runtime;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  if (in_ESI != 0) {
    if (*(long *)(lVar1 + 0x68) != 0) {
      lVar2 = (**(code **)(*(long *)(in_RDI + 0x18) + 0x170))
                        (in_RDI,0,*(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x20) + 8) + 0x50),
                         in_RCX);
      *(int *)(lVar2 + 0x18) = in_ESI;
      *(undefined4 *)(lVar2 + 0x1c) = in_EDX;
      *(undefined8 *)(lVar1 + 0x78) = in_R8;
      *(long *)(lVar1 + 0x60) = lVar2;
      (**(code **)(*(long *)(in_RDI + 0x10) + 0x40))(*(undefined8 *)(lVar1 + 0x68),in_ESI);
    }
    (**(code **)(*(long *)(in_RDI + 0x10) + 0x90))
              (1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
               ,0x302);
    return;
  }
  __assert_fail("symbol != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
                ,0x2f6,"void KRuntime_raise(KonohaContext *, int, int, kString *, KonohaStack *)");
}

Assistant:

static void KRuntime_raise(KonohaContext *kctx, int symbol, int fault, kString *optionalErrorInfo, KonohaStack *top)
{
	KRuntimeContextVar *runtime = kctx->stack;
	KNH_ASSERT(symbol != 0);
	if(runtime->evaljmpbuf != NULL) {
		kException *e = new_(Exception, optionalErrorInfo, NULL);
		e->symbol = symbol;
		e->fault  = fault;
		runtime->topStack = top;
		//runtime->faultInfo = fault;
		if(true/*optionalErrorInfo != NULL*/) {
			KUnsafeFieldSet(runtime->ThrownException, e);
		}
		PLATAPI longjmp_i(*runtime->evaljmpbuf, symbol);  // in setjmp 0 means good
	}
	KExit(EXIT_FAILURE);
}